

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O2

void conditionalBranchStatement(object *proc,int retSize)

{
  int L;
  item *x;
  char *msg;
  
  x = (item *)calloc(1,0x30);
  if (currentSymbol == 0x12d) {
    getSymbol();
    expression(x);
    cJump(x);
    if (currentSymbol == 0x12e) {
      getSymbol();
      if (currentSymbol == 0x131) {
        getSymbol();
        statementSequence(proc,retSize);
        if (currentSymbol == 0x132) {
          getSymbol();
          L = 0;
          while (currentSymbol == 0x25c) {
            getSymbol();
            if (currentSymbol == 0x12d) {
              getSymbol();
              L = fJump(L);
              fixLink(x->a);
              expression(x);
              cJump(x);
              if (currentSymbol != 0x12e) goto LAB_00105f58;
              getSymbol();
            }
            if (currentSymbol != 0x131) goto LAB_00105f46;
            getSymbol();
            statementSequence(proc,retSize);
            if (currentSymbol != 0x132) {
              msg = "missing right curly bracket in elseif";
              goto LAB_00105f5f;
            }
            getSymbol();
          }
          if (currentSymbol != 0x25b) {
            fixLink(x->a);
LAB_00105f35:
            fixLink(L);
            return;
          }
          getSymbol();
          L = fJump(L);
          fixLink(x->a);
          if (currentSymbol != 0x131) {
            msg = "missing left curly bracket in else";
            goto LAB_00105f5f;
          }
          getSymbol();
          statementSequence(proc,retSize);
          if (currentSymbol == 0x132) {
            getSymbol();
            goto LAB_00105f35;
          }
        }
        msg = "missing right curly bracket";
      }
      else {
LAB_00105f46:
        msg = "missing left curly bracket";
      }
    }
    else {
LAB_00105f58:
      msg = "missing closing right paranetheses of if statement";
    }
  }
  else {
    msg = "missing left paranetheses in if statement";
  }
LAB_00105f5f:
  mark(msg);
  exit(-1);
}

Assistant:

procedure 
void conditionalBranchStatement(struct object *proc, int retSize) {
	variable int L;
	variable struct item *x;
	x=NULL; L=0;
	allocMem(x);
	if (currentSymbol == SYMBOL_LPARAN) {
		getSymbol();
		expression(x);
		cJump(x);
		if (currentSymbol == SYMBOL_RPARAN) {
			getSymbol();
		} else {
			mark("missing closing right paranetheses of if statement");
			exit(-1);
		}
	} else {
		mark("missing left paranetheses in if statement");
		exit(-1);
	}
	if (currentSymbol == SYMBOL_CLBRAK) {
		getSymbol(); 
		statementSequence(proc, retSize); L = 0;
		if (currentSymbol == SYMBOL_CRBRAK) {
			getSymbol();
		} else {
			mark("missing right curly bracket");
			exit(-1);
		}
	} else {
		mark("missing left curly bracket");
		exit(-1);
	}
	while (currentSymbol == SYMBOL_ELSIF) {
		getSymbol();
		if (currentSymbol == SYMBOL_LPARAN) {
			getSymbol(); L = fJump(L); fixLink(x->a); expression(x); cJump(x);
			if (currentSymbol == SYMBOL_RPARAN) {
				getSymbol();
			} else {
				mark("missing closing right paranetheses of if statement");
				exit(-1);
			}
		}
		if (currentSymbol == SYMBOL_CLBRAK) {
			getSymbol(); statementSequence(proc, retSize);
			if (currentSymbol == SYMBOL_CRBRAK) {
				getSymbol();
			} else {
				mark("missing right curly bracket in elseif");
					exit(-1);
			}
		} else {
			mark("missing left curly bracket");
			exit(-1);
		}
	}
    if (currentSymbol == SYMBOL_ELSE) {
		getSymbol(); 
		L = fJump(L); 
		fixLink(x->a);
		if (currentSymbol == SYMBOL_CLBRAK) {
			getSymbol(); statementSequence(proc, retSize);
			if (currentSymbol == SYMBOL_CRBRAK) {
				getSymbol();
			} else {
				mark("missing right curly bracket");
				exit(-1);
			}
		} else {
			mark("missing left curly bracket in else");
			exit(-1);
		}
	} else {
		fixLink(x->a);
	}
	fixLink(L);
}